

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_aux.c
# Opt level: O2

char * luaL_gsub(lua_State *L,char *s,char *p,char *r)

{
  size_t sVar1;
  char *pcVar2;
  luaL_Buffer b;
  
  sVar1 = strlen(p);
  b.p = b.buffer;
  b.lvl = 0;
  b.L = L;
  while( true ) {
    pcVar2 = strstr(s,p);
    if (pcVar2 == (char *)0x0) break;
    luaL_addlstring(&b,s,(long)pcVar2 - (long)s);
    luaL_addstring(&b,r);
    s = pcVar2 + sVar1;
  }
  luaL_addstring(&b,s);
  luaL_pushresult(&b);
  pcVar2 = lua_tolstring(L,-1,(size_t *)0x0);
  return pcVar2;
}

Assistant:

LUALIB_API const char *luaL_gsub(lua_State *L, const char *s,
				 const char *p, const char *r)
{
  const char *wild;
  size_t l = strlen(p);
  luaL_Buffer b;
  luaL_buffinit(L, &b);
  while ((wild = strstr(s, p)) != NULL) {
    luaL_addlstring(&b, s, (size_t)(wild - s));  /* push prefix */
    luaL_addstring(&b, r);  /* push replacement in place of pattern */
    s = wild + l;  /* continue after `p' */
  }
  luaL_addstring(&b, s);  /* push last suffix */
  luaL_pushresult(&b);
  return lua_tostring(L, -1);
}